

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Lexer *lexer_00;
  Parser *parser_00;
  Tree *pTVar2;
  int *piVar3;
  Parser *parser;
  Lexer *lexer;
  char **argv_local;
  int argc_local;
  
  log_level_ = 0xf;
  signal(0xb,handler);
  signal(6,handler);
  signal(8,handler);
  iVar1 = _setjmp((__jmp_buf_tag *)buf);
  if (iVar1 == 0) {
    lexer_00 = new_lexer(argv[1]);
    parser_00 = new_parser(lexer_00);
    pTVar2 = parse(parser_00);
    (*(pTVar2->node).eval)((Env *)0x0,parser_00->tree);
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 4) {
      log_error(anon_var_dwarf_23);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    level = LOG_LEVEL_DEBUG;
    signal(SIGSEGV, handler);
    signal(SIGABRT, handler);
    signal(SIGFPE, handler);
    try(buf) {
        Lexer *lexer = new_lexer(argv[1]);
        Parser *parser = new_parser(lexer);
        tree_node(parse(parser))->eval(NULL, parser->tree);
    } catch(4) {
        log_error("遇到错误!!");
    }
    return 0;
}